

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::Value::Value(Value *this,string *value)

{
  char *pcVar1;
  
  *(ushort *)&this->field_0x8 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | 0x104;
  this->limit_ = 0;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = 0;
  pcVar1 = duplicateStringValue((value->_M_dataplus)._M_p,(uint)value->_M_string_length);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const std::string& value)
    : type_(stringValue), allocated_(true)
#ifdef JSON_VALUE_USE_INTERNAL_MAP
      ,
      itemIsUsed_(0)
#endif
      ,
      comments_(0), start_(0), limit_(0) {
  value_.string_ =
      duplicateStringValue(value.c_str(), (unsigned int)value.length());
}